

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_decoder_init_vfs_w
                    (ma_vfs *pVFS,wchar_t *pFilePath,ma_decoder_config *pConfig,ma_decoder *pDecoder
                    )

{
  ma_bool32 mVar1;
  ma_decoder_config config;
  ma_result result;
  wchar_t *in_stack_00001ed0;
  wchar_t *in_stack_00001ed8;
  ma_decoder *in_stack_fffffffffffffea8;
  ma_decoder *in_stack_fffffffffffffeb0;
  ma_decoder_config *in_stack_fffffffffffffeb8;
  ma_decoder *in_stack_fffffffffffffec0;
  ma_decoder_config *in_stack_fffffffffffffec8;
  undefined1 local_c0 [112];
  int local_50;
  ma_result local_2c;
  ma_result local_4;
  
  ma_decoder_config_init_copy((ma_decoder_config *)in_stack_fffffffffffffeb0);
  memcpy(local_c0,&stack0xfffffffffffffeb0,0x90);
  local_4 = ma_decoder__preinit_vfs_w
                      (in_stack_fffffffffffffec8,(wchar_t *)in_stack_fffffffffffffec0,
                       in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
  if (local_4 == MA_SUCCESS) {
    local_2c = MA_NO_BACKEND;
    if (local_50 != 0) {
      if (local_50 == 1) {
        local_2c = ma_decoder_init_wav__internal
                             ((ma_decoder_config *)in_stack_fffffffffffffeb0,
                              in_stack_fffffffffffffea8);
      }
      if (local_50 == 2) {
        local_2c = ma_decoder_init_flac__internal
                             ((ma_decoder_config *)in_stack_fffffffffffffeb0,
                              in_stack_fffffffffffffea8);
      }
      if (local_50 == 3) {
        local_2c = ma_decoder_init_mp3__internal
                             ((ma_decoder_config *)in_stack_fffffffffffffeb0,
                              in_stack_fffffffffffffea8);
      }
      if (local_50 == 4) {
        local_2c = ma_decoder_init_vorbis__internal
                             ((ma_decoder_config *)in_stack_fffffffffffffeb0,
                              in_stack_fffffffffffffea8);
      }
      if (local_2c != MA_SUCCESS) {
        ma_decoder__on_seek_vfs
                  (in_stack_fffffffffffffeb0,(ma_int64)in_stack_fffffffffffffea8,
                   ma_seek_origin_start);
      }
    }
    if (local_2c != MA_SUCCESS) {
      if ((local_2c != MA_SUCCESS) &&
         (local_2c = ma_decoder_init_custom__internal
                               (in_stack_fffffffffffffec8,in_stack_fffffffffffffec0),
         local_2c != MA_SUCCESS)) {
        ma_decoder__on_seek_vfs
                  (in_stack_fffffffffffffeb0,(ma_int64)in_stack_fffffffffffffea8,
                   ma_seek_origin_start);
      }
      if (local_50 != 0) {
        return MA_NO_BACKEND;
      }
      if (((local_2c != MA_SUCCESS) &&
          (mVar1 = ma_path_extension_equal_w(in_stack_00001ed8,in_stack_00001ed0), mVar1 != 0)) &&
         (local_2c = ma_decoder_init_wav__internal
                               ((ma_decoder_config *)in_stack_fffffffffffffeb0,
                                in_stack_fffffffffffffea8), local_2c != MA_SUCCESS)) {
        ma_decoder__on_seek_vfs
                  (in_stack_fffffffffffffeb0,(ma_int64)in_stack_fffffffffffffea8,
                   ma_seek_origin_start);
      }
      if (((local_2c != MA_SUCCESS) &&
          (mVar1 = ma_path_extension_equal_w(in_stack_00001ed8,in_stack_00001ed0), mVar1 != 0)) &&
         (local_2c = ma_decoder_init_flac__internal
                               ((ma_decoder_config *)in_stack_fffffffffffffeb0,
                                in_stack_fffffffffffffea8), local_2c != MA_SUCCESS)) {
        ma_decoder__on_seek_vfs
                  (in_stack_fffffffffffffeb0,(ma_int64)in_stack_fffffffffffffea8,
                   ma_seek_origin_start);
      }
      if (((local_2c != MA_SUCCESS) &&
          (mVar1 = ma_path_extension_equal_w(in_stack_00001ed8,in_stack_00001ed0), mVar1 != 0)) &&
         (local_2c = ma_decoder_init_mp3__internal
                               ((ma_decoder_config *)in_stack_fffffffffffffeb0,
                                in_stack_fffffffffffffea8), local_2c != MA_SUCCESS)) {
        ma_decoder__on_seek_vfs
                  (in_stack_fffffffffffffeb0,(ma_int64)in_stack_fffffffffffffea8,
                   ma_seek_origin_start);
      }
    }
    if (local_2c == MA_SUCCESS) {
      local_2c = ma_decoder__postinit(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
    }
    else {
      local_2c = ma_decoder_init__internal
                           ((ma_decoder_read_proc)in_stack_fffffffffffffec8,
                            (ma_decoder_seek_proc)in_stack_fffffffffffffec0,
                            in_stack_fffffffffffffeb8,(ma_decoder_config *)in_stack_fffffffffffffeb0
                            ,in_stack_fffffffffffffea8);
    }
    if (local_2c == MA_SUCCESS) {
      local_4 = MA_SUCCESS;
    }
    else {
      ma_vfs_or_default_close(in_stack_fffffffffffffea8,(ma_vfs_file)0x245ece);
      local_4 = local_2c;
    }
  }
  return local_4;
}

Assistant:

MA_API ma_result ma_decoder_init_vfs_w(ma_vfs* pVFS, const wchar_t* pFilePath, const ma_decoder_config* pConfig, ma_decoder* pDecoder)
{
    ma_result result;
    ma_decoder_config config;

    config = ma_decoder_config_init_copy(pConfig);
    result = ma_decoder__preinit_vfs_w(pVFS, pFilePath, &config, pDecoder);
    if (result != MA_SUCCESS) {
        return result;
    }

    result = MA_NO_BACKEND;

    if (config.encodingFormat != ma_encoding_format_unknown) {
    #ifdef MA_HAS_WAV
        if (config.encodingFormat == ma_encoding_format_wav) {
            result = ma_decoder_init_wav__internal(&config, pDecoder);
        }
    #endif
    #ifdef MA_HAS_FLAC
        if (config.encodingFormat == ma_encoding_format_flac) {
            result = ma_decoder_init_flac__internal(&config, pDecoder);
        }
    #endif
    #ifdef MA_HAS_MP3
        if (config.encodingFormat == ma_encoding_format_mp3) {
            result = ma_decoder_init_mp3__internal(&config, pDecoder);
        }
    #endif
    #ifdef MA_HAS_VORBIS
        if (config.encodingFormat == ma_encoding_format_vorbis) {
            result = ma_decoder_init_vorbis__internal(&config, pDecoder);
        }
    #endif

        /* Make sure we seek back to the start if we didn't initialize a decoder successfully so the next attempts have a fresh start. */
        if (result != MA_SUCCESS) {
            ma_decoder__on_seek_vfs(pDecoder, 0, ma_seek_origin_start);
        }
    }

    if (result != MA_SUCCESS) {
        /* Getting here means we weren't able to initialize a decoder of a specific encoding format. */

        /*
        We use trial and error to open a decoder. We prioritize custom decoders so that if they
        implement the same encoding format they take priority over the built-in decoders.
        */
        if (result != MA_SUCCESS) {
            result = ma_decoder_init_custom__internal(&config, pDecoder);
            if (result != MA_SUCCESS) {
                ma_decoder__on_seek_vfs(pDecoder, 0, ma_seek_origin_start);
            }
        }

        /*
        If we get to this point and we still haven't found a decoder, and the caller has requested a
        specific encoding format, there's no hope for it. Abort.
        */
        if (config.encodingFormat != ma_encoding_format_unknown) {
            return MA_NO_BACKEND;
        }

    #ifdef MA_HAS_WAV
        if (result != MA_SUCCESS && ma_path_extension_equal_w(pFilePath, L"wav")) {
            result = ma_decoder_init_wav__internal(&config, pDecoder);
            if (result != MA_SUCCESS) {
                ma_decoder__on_seek_vfs(pDecoder, 0, ma_seek_origin_start);
            }
        }
    #endif
    #ifdef MA_HAS_FLAC
        if (result != MA_SUCCESS && ma_path_extension_equal_w(pFilePath, L"flac")) {
            result = ma_decoder_init_flac__internal(&config, pDecoder);
            if (result != MA_SUCCESS) {
                ma_decoder__on_seek_vfs(pDecoder, 0, ma_seek_origin_start);
            }
        }
    #endif
    #ifdef MA_HAS_MP3
        if (result != MA_SUCCESS && ma_path_extension_equal_w(pFilePath, L"mp3")) {
            result = ma_decoder_init_mp3__internal(&config, pDecoder);
            if (result != MA_SUCCESS) {
                ma_decoder__on_seek_vfs(pDecoder, 0, ma_seek_origin_start);
            }
        }
    #endif
    }

    /* If we still haven't got a result just use trial and error. Otherwise we can finish up. */
    if (result != MA_SUCCESS) {
        result = ma_decoder_init__internal(ma_decoder__on_read_vfs, ma_decoder__on_seek_vfs, NULL, &config, pDecoder);
    } else {
        result = ma_decoder__postinit(&config, pDecoder);
    }

    if (result != MA_SUCCESS) {
        ma_vfs_or_default_close(pVFS, pDecoder->data.vfs.file);
        return result;
    }

    return MA_SUCCESS;
}